

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
libcellml::Units::unitAttributes
          (Units *this,string *reference,string *prefix,double *exponent,double *multiplier,
          string *id)

{
  UnitsImpl *pUVar1;
  size_t index;
  __normal_iterator<const_libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_78 [3];
  __normal_iterator<const_libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_60;
  undefined1 local_58 [8];
  string dummyReference;
  string *id_local;
  double *multiplier_local;
  double *exponent_local;
  string *prefix_local;
  string *reference_local;
  Units *this_local;
  
  dummyReference.field_2._8_8_ = id;
  std::__cxx11::string::string((string *)local_58);
  pUVar1 = pFunc(this);
  local_60._M_current = (UnitDefinition *)UnitsImpl::findUnit(pUVar1,reference);
  pUVar1 = pFunc(this);
  local_78[0]._M_current =
       (UnitDefinition *)
       std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::begin
                 (&pUVar1->mUnitDefinitions);
  index = __gnu_cxx::operator-(&local_60,local_78);
  unitAttributes(this,index,(string *)local_58,prefix,exponent,multiplier,
                 (string *)dummyReference.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void Units::unitAttributes(const std::string &reference, std::string &prefix, double &exponent, double &multiplier, std::string &id) const
{
    std::string dummyReference;
    unitAttributes(static_cast<size_t>(pFunc()->findUnit(reference) - pFunc()->mUnitDefinitions.begin()), dummyReference, prefix, exponent, multiplier, id);
}